

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformValueIntCase::test(UniformValueIntCase *this)

{
  GLuint shader;
  GLuint shader_00;
  GLuint program_00;
  GLint GVar1;
  GLint location;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  UniformValueIntCase *this_local;
  
  shader = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader
                        (&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader,1,&test::testVertSource,(GLint *)0x0
            );
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader_00,1,&test::testFragSource,
             (GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program_00 = glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,program_00,shader)
  ;
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ApiCase).super_CallLogWrapper,program_00,shader_00);
  glu::CallLogWrapper::glLinkProgram(&(this->super_ApiCase).super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,program_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ApiCase).super_CallLogWrapper,program_00,"intUniform");
  glu::CallLogWrapper::glUniform1i(&(this->super_ApiCase).super_CallLogWrapper,GVar1,1);
  verifyUniformValue1i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,program_00,GVar1,1);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ApiCase).super_CallLogWrapper,program_00,"int2Uniform");
  glu::CallLogWrapper::glUniform2i(&(this->super_ApiCase).super_CallLogWrapper,GVar1,1,2);
  verifyUniformValue2i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,program_00,GVar1,1,2);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ApiCase).super_CallLogWrapper,program_00,"int3Uniform");
  glu::CallLogWrapper::glUniform3i(&(this->super_ApiCase).super_CallLogWrapper,GVar1,1,2,3);
  verifyUniformValue3i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,program_00,GVar1,1,2,3);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_ApiCase).super_CallLogWrapper,program_00,"int4Uniform");
  glu::CallLogWrapper::glUniform4i(&(this->super_ApiCase).super_CallLogWrapper,GVar1,1,2,3,4);
  verifyUniformValue4i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,program_00,GVar1,1,2,3,4);
  glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,program_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp int intUniform;\n"
			"uniform highp ivec2 int2Uniform;\n"
			"uniform highp ivec3 int3Uniform;\n"
			"uniform highp ivec4 int4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(float(intUniform + int2Uniform.x + int3Uniform.x + int4Uniform.x));\n"
			"}\n";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		glUseProgram(program);
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program,"intUniform");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program, location, 1);

		location = glGetUniformLocation(program,"int2Uniform");
		glUniform2i(location, 1, 2);
		verifyUniformValue2i(m_testCtx, *this, program, location, 1, 2);

		location = glGetUniformLocation(program,"int3Uniform");
		glUniform3i(location, 1, 2, 3);
		verifyUniformValue3i(m_testCtx, *this, program, location, 1, 2, 3);

		location = glGetUniformLocation(program,"int4Uniform");
		glUniform4i(location, 1, 2, 3, 4);
		verifyUniformValue4i(m_testCtx, *this, program, location, 1, 2, 3, 4);

		glUseProgram(0);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}